

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov1detection.cpp
# Opt level: O3

int __thiscall
ncnn::Yolov1Detection::forward_inplace(Yolov1Detection *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  Mat *pMVar2;
  uint uVar3;
  ulong uVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  long lVar9;
  int iVar10;
  int *piVar11;
  float *pfVar12;
  float fVar13;
  float fVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  float fVar17;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> detected_objects;
  ObjectsManager objects;
  pointer local_d8;
  pointer pOStack_d0;
  undefined8 local_c8;
  uint local_b8;
  float local_b4;
  Mat *local_b0;
  Option *local_a8;
  ulong local_a0;
  ObjectsManager local_98;
  undefined4 local_70;
  int local_6c;
  undefined8 local_68;
  long local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar7 = this->side;
  iVar10 = iVar7 * iVar7;
  iVar6 = this->box_num;
  if (bottom_top_blob->w < (iVar6 * 5 + this->classes) * iVar10) {
    return -1;
  }
  if (this->softmax_enable != 0) {
    local_6c = this->classes * iVar10;
    local_98.object_boxs_table.
    super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)bottom_top_blob->data;
    local_98.object_boxs_table.
    super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bottom_top_blob->elemsize;
    local_98.prob_steps._0_4_ = bottom_top_blob->elempack;
    local_98.step = (size_t)bottom_top_blob->allocator;
    local_98.object_boxs_table.
    super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70 = 1;
    local_68 = 0x100000001;
    local_60 = (long)local_6c;
    (*this->softmax->_vptr_Layer[9])(this->softmax,&local_98,opt);
    if (local_98.object_boxs_table.
        super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      LOCK();
      *(int *)local_98.object_boxs_table.
              super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
           *(int *)local_98.object_boxs_table.
                   super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
      UNLOCK();
      if (*(int *)local_98.object_boxs_table.
                  super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish == 0) {
        if ((Allocator *)local_98.step == (Allocator *)0x0) {
          if (local_98.object_boxs_table.
              super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            free(local_98.object_boxs_table.
                 super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          (*(*(_func_int ***)local_98.step)[3])();
        }
      }
    }
    iVar6 = this->box_num;
  }
  local_b0 = bottom_top_blob;
  local_a8 = opt;
  ObjectsManager::ObjectsManager(&local_98,(long)((iVar6 * iVar10) / 0x14));
  if (iVar7 != 0) {
    pvVar8 = local_b0->data;
    iVar7 = this->classes;
    iVar6 = this->box_num;
    pfVar5 = (float *)((long)pvVar8 + (long)(iVar7 * iVar10) * 4);
    pfVar12 = pfVar5 + iVar6 * iVar10;
    local_b8 = iVar10 + (uint)(iVar10 == 0);
    uVar4 = 0;
    do {
      local_a0 = uVar4;
      if (0 < iVar6) {
        local_58 = CONCAT44((float)((int)uVar4 / this->side),(float)((int)uVar4 % this->side));
        uStack_50 = 0;
        iVar10 = 0;
        do {
          uVar4 = *(ulong *)(pfVar12 + 2);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar4;
          uVar3 = (uint)(this->sqrt_enable == 0);
          auVar14._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
          auVar14._8_8_ = 0;
          fVar13 = SUB164(~auVar14 & auVar16,0) * (float)uVar4 + (float)(auVar14._0_8_ & uVar4);
          fVar15 = SUB164(~auVar14 & auVar16,4) * (float)(uVar4 >> 0x20) +
                   (float)((auVar14._0_8_ & uVar4) >> 0x20);
          if (0 < iVar7) {
            fVar17 = 1.0 / (float)this->side;
            local_48 = fVar17 * ((float)*(undefined8 *)pfVar12 + (float)local_58) + fVar13 * -0.5;
            fStack_44 = fVar17 * ((float)((ulong)*(undefined8 *)pfVar12 >> 0x20) + local_58._4_4_) +
                        fVar15 * -0.5;
            fStack_40 = fVar13 + local_48;
            fStack_3c = fVar15 + fStack_44;
            fVar13 = *pfVar5;
            lVar9 = 0;
            local_b4 = fVar13;
            do {
              fVar15 = *(float *)((long)pvVar8 + lVar9 * 4) * fVar13;
              if (this->confidence_threshold <= fVar15 && fVar15 != this->confidence_threshold) {
                local_d8 = (pointer)CONCAT44(fStack_44,local_48);
                pOStack_d0 = (pointer)CONCAT44(fStack_3c,fStack_40);
                local_c8 = (pointer)CONCAT44((int)lVar9,fVar15);
                ObjectsManager::add_new_object_box(&local_98,(ObjectBox *)&local_d8);
                iVar7 = this->classes;
                fVar13 = local_b4;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < iVar7);
            iVar6 = this->box_num;
          }
          pfVar12 = pfVar12 + 4;
          pfVar5 = pfVar5 + 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 < iVar6);
      }
      pvVar8 = (void *)((long)pvVar8 + (long)iVar7 * 4);
      uVar3 = (int)local_a0 + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar3 != local_b8);
  }
  local_d8 = (pointer)0x0;
  pOStack_d0 = (pointer)0x0;
  local_c8 = (pointer)0x0;
  ObjectsManager::do_objects_nms
            (&local_98,(vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)&local_d8,
             this->nms_threshold,this->confidence_threshold);
  pMVar2 = local_b0;
  Mat::create(local_b0,6,(int)((ulong)((long)pOStack_d0 - (long)local_d8) >> 3) * -0x55555555,4,
              local_a8->blob_allocator);
  if (pMVar2->data == (void *)0x0) {
    iVar7 = -100;
LAB_00173b48:
    if (local_d8 == (pointer)0x0) goto LAB_00173b5a;
  }
  else {
    if ((long)pMVar2->c * pMVar2->cstep == 0) {
      iVar7 = -100;
      goto LAB_00173b48;
    }
    if ((long)pOStack_d0 - (long)local_d8 == 0) {
      iVar7 = 0;
      goto LAB_00173b48;
    }
    lVar9 = ((long)pOStack_d0 - (long)local_d8 >> 3) * -0x5555555555555555;
    iVar7 = pMVar2->w;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    sVar1 = pMVar2->elemsize;
    pfVar5 = (float *)((long)pMVar2->data + 0x14);
    piVar11 = &local_d8->classid;
    do {
      pfVar5[-5] = (float)(*piVar11 + 1);
      pfVar5[-4] = (float)piVar11[-1];
      pfVar5[-3] = ((ObjectBox *)(piVar11 + -5))->xmin;
      pfVar5[-2] = (float)piVar11[-4];
      pfVar5[-1] = (float)piVar11[-3];
      *pfVar5 = (float)piVar11[-2];
      pfVar5 = (float *)((long)pfVar5 + (long)iVar7 * sVar1);
      piVar11 = piVar11 + 6;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    iVar7 = 0;
  }
  operator_delete(local_d8,(long)local_c8 - (long)local_d8);
LAB_00173b5a:
  ObjectsManager::~ObjectsManager(&local_98);
  return iVar7;
}

Assistant:

int Yolov1Detection::forward_inplace(Mat &bottom_top_blob, const Option &opt) const
{
    int size = side * side;
    int map_total = size * (box_num * 5 + classes);
    if (bottom_top_blob.w < map_total)
        return -1;

    if (softmax_enable)
    {
        Mat classes_scores = bottom_top_blob.range(0, size * classes);
        classes_scores.reshape(classes, size);
        softmax->forward_inplace(classes_scores, opt);
    }

    ObjectsManager objects(size * box_num / 20);
    const float *classes_ptr = bottom_top_blob;
    const float *scales_ptr = classes_ptr + size * classes;
    const float *boxes_ptr = scales_ptr + size * box_num;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < size; i++)
    {
        int x_offset = i % side;
        int y_offset = i / side;

        for (int n = 0; n < box_num; n++)
        {

            float w = (sqrt_enable == 0) * boxes_ptr[2] + (sqrt_enable != 0) * boxes_ptr[2] * boxes_ptr[2];
            float h = (sqrt_enable == 0) * boxes_ptr[3] + (sqrt_enable != 0) * boxes_ptr[3] * boxes_ptr[3];
            float xmin = (boxes_ptr[0] + x_offset) / side - w * 0.5f;
            float ymin = (boxes_ptr[1] + y_offset) / side - h * 0.5f;
            float xmax = xmin + w;
            float ymax = ymin + h;
            boxes_ptr += 4;

            float scale = scales_ptr[0];
            scales_ptr++;

            for (int j = 0; j < classes; j++)
            {
                float prob = scale * classes_ptr[j];
                if (prob > confidence_threshold)
                {
                    ObjectBox object = {
                        .xmin = xmin,
                        .ymin = ymin,
                        .xmax = xmax,
                        .ymax = ymax,
                        .prob = prob,
                        .classid = j,
                    };
                    objects.add_new_object_box(object);
                }
            }
        }

        classes_ptr += classes;
    }

    std::vector<ObjectBox> detected_objects;
    objects.do_objects_nms(detected_objects, nms_threshold, confidence_threshold);

    bottom_top_blob.create(6, (int)detected_objects.size(), 4u, opt.blob_allocator);
    if (bottom_top_blob.empty())
        return -100;

    for (int i = 0; i < detected_objects.size(); i++)
    {
        const ObjectBox &r = detected_objects[i];
        float *outptr = bottom_top_blob.row(i);

        outptr[0] = r.classid + 1; // 0 reserve for background
        outptr[1] = r.prob;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}